

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O3

bool __thiscall
DirectorBase::ShouldCut
          (DirectorBase *this,ChessTickType currentTime,int nScore,uint nDepthSearched,
          Position *rootPosition,Moves *mPrincipalVariation)

{
  bool bVar1;
  ulong uVar2;
  
  bVar1 = true;
  if (nDepthSearched < 100) {
    if (this->m_nDepth == 0) {
      uVar2 = (ulong)this->m_nMoveTime;
      if (uVar2 == 0) {
        if (this->m_bInfinite != false) {
          return false;
        }
        uVar2 = this->m_SearchStopTime;
        if (uVar2 == 0) {
          (*this->_vptr_DirectorBase[5])(this,currentTime);
          uVar2 = this->m_SearchStopTime;
        }
      }
      bVar1 = (long)uVar2 <= currentTime;
    }
    else {
      bVar1 = this->m_nDepth <= nDepthSearched;
    }
  }
  return bVar1;
}

Assistant:

virtual bool ShouldCut(
        const Clock::ChessTickType currentTime,
        const int nScore,
        const unsigned int nDepthSearched,
        const Position &rootPosition,
        const Moves &mPrincipalVariation
    )
    {
        /* This can happen in late end game. */
        if ( nDepthSearched >= 100 )
            return true;

        if ( m_nDepth != 0 )
            return ( nDepthSearched >= m_nDepth );

        if ( m_nMoveTime != 0 )
            return ( currentTime >= m_nMoveTime );

        if ( m_bInfinite )
            return false;

        if ( m_SearchStopTime == 0 )
            CalculateSearchStopTime( currentTime, nScore, nDepthSearched,
                                     rootPosition, mPrincipalVariation );

        return ( currentTime >= m_SearchStopTime );
    }